

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseEncodedCharacterString3(CFIReaderImpl *this)

{
  uint8_t *len_00;
  DeadlyImportError *pDVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  CFIReaderImpl *in_RSI;
  shared_ptr<const_Assimp::FIValue> sVar3;
  string local_c8;
  undefined1 local_a8 [16];
  string local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  size_t index;
  byte local_29;
  pointer pbStack_28;
  uint8_t b;
  size_t len;
  CFIReaderImpl *this_local;
  shared_ptr<const_Assimp::FIValue> *result;
  
  len._7_1_ = 0;
  this_local = this;
  std::shared_ptr<const_Assimp::FIValue>::shared_ptr((shared_ptr<const_Assimp::FIValue> *)this);
  local_29 = *in_RSI->dataP;
  if ((local_29 & 0x20) == 0) {
    pbStack_28 = (pointer)parseNonEmptyOctetString5Length(in_RSI);
    len_00 = in_RSI->dataP;
    if ((long)in_RSI->dataEnd - (long)len_00 < (long)pbStack_28) {
      pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar1,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if ((local_29 & 0x10) == 0) {
      parseUTF8String_abi_cxx11_
                (&local_c8,(Assimp *)in_RSI->dataP,(uint8_t *)pbStack_28,(size_t)len_00);
      FIStringValue::create((FIStringValue *)local_a8,&local_c8);
      std::shared_ptr<Assimp::FIValue_const>::operator=
                ((shared_ptr<Assimp::FIValue_const> *)this,
                 (shared_ptr<Assimp::FIStringValue> *)local_a8);
      std::shared_ptr<Assimp::FIStringValue>::~shared_ptr
                ((shared_ptr<Assimp::FIStringValue> *)local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      _Var2._M_pi = extraout_RDX_02;
    }
    else {
      if (((ulong)pbStack_28 & 1) != 0) {
        pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar1,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      parseUTF16String_abi_cxx11_
                ((string *)(local_a8 + 0x10),(Assimp *)in_RSI->dataP,(uint8_t *)pbStack_28,
                 (size_t)len_00);
      FIStringValue::create((FIStringValue *)local_78,(string *)(local_a8 + 0x10));
      std::shared_ptr<Assimp::FIValue_const>::operator=
                ((shared_ptr<Assimp::FIValue_const> *)this,
                 (shared_ptr<Assimp::FIStringValue> *)local_78);
      std::shared_ptr<Assimp::FIStringValue>::~shared_ptr
                ((shared_ptr<Assimp::FIStringValue> *)local_78);
      std::__cxx11::string::~string((string *)(local_a8 + 0x10));
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  else {
    in_RSI->dataP = in_RSI->dataP + 1;
    if ((long)in_RSI->dataEnd - (long)in_RSI->dataP < 1) {
      pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar1,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    local_58._16_8_ = ZEXT48((local_29 & 0xf) << 4 | (uint)(*in_RSI->dataP >> 4));
    pbStack_28 = (pointer)parseNonEmptyOctetString5Length(in_RSI);
    if ((long)in_RSI->dataEnd - (long)in_RSI->dataP < (long)pbStack_28) {
      pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar1,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if ((local_29 & 0x10) == 0) {
      parseRestrictedAlphabet((CFIReaderImpl *)local_68,(size_t)in_RSI,local_58._16_8_);
      std::shared_ptr<const_Assimp::FIValue>::operator=
                ((shared_ptr<const_Assimp::FIValue> *)this,
                 (shared_ptr<const_Assimp::FIValue> *)local_68);
      std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                ((shared_ptr<const_Assimp::FIValue> *)local_68);
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      parseEncodedData((CFIReaderImpl *)local_58,(size_t)in_RSI,local_58._16_8_);
      std::shared_ptr<const_Assimp::FIValue>::operator=
                ((shared_ptr<const_Assimp::FIValue> *)this,
                 (shared_ptr<const_Assimp::FIValue> *)local_58);
      std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                ((shared_ptr<const_Assimp::FIValue> *)local_58);
      _Var2._M_pi = extraout_RDX;
    }
  }
  in_RSI->dataP = in_RSI->dataP + (long)&pbStack_28->_M_dataplus;
  sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseEncodedCharacterString3() { // C.19
        std::shared_ptr<const FIValue> result;
        size_t len;
        uint8_t b = *dataP;
        if (b & 0x20) {
            ++dataP;
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            size_t index = ((b & 0x0f) << 4) | ((*dataP & 0xf0) >> 4); // C.29
            len = parseNonEmptyOctetString5Length();
            if (dataEnd - dataP < static_cast<ptrdiff_t>(len)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            if (b & 0x10) {
                // encoding algorithm (C.19.3.4)
                result = parseEncodedData(index, len);
            }
            else {
                // Restricted alphabet (C.19.3.3)
                result = parseRestrictedAlphabet(index, len);
            }
        }
        else {
            len = parseNonEmptyOctetString5Length();
            if (dataEnd - dataP < static_cast<ptrdiff_t>(len)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            if (b & 0x10) {
                // UTF-16 (C.19.3.2)
                if (len & 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                result = FIStringValue::create(parseUTF16String(dataP, len));
            }
            else {
                // UTF-8 (C.19.3.1)
                result = FIStringValue::create(parseUTF8String(dataP, len));
            }
        }
        dataP += len;
        return result;
    }